

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_trace_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  ushort *puVar2;
  short *psVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  parasail_result_t *ppVar39;
  __m128i *ptr;
  __m128i *palVar40;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *palVar41;
  __m128i *ptr_02;
  int16_t *ptr_03;
  __m128i *ptr_04;
  int16_t iVar42;
  uint uVar43;
  long lVar44;
  __m128i *ptr_05;
  char *pcVar45;
  long lVar46;
  uint uVar47;
  char *__format;
  int a;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  int32_t segNum;
  long lVar51;
  long lVar52;
  undefined8 unaff_R12;
  int iVar53;
  ulong size;
  bool bVar54;
  short sVar55;
  short sVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  short sVar73;
  short sVar75;
  short sVar76;
  short sVar78;
  short sVar80;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i_16_t _Var62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  short sVar71;
  short sVar82;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar72;
  short sVar74;
  short sVar77;
  short sVar79;
  short sVar81;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  __m128i alVar70;
  ulong uVar83;
  undefined1 auVar84 [16];
  ushort uVar85;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar95;
  ushort uVar97;
  undefined1 in_XMM2 [16];
  ushort uVar99;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  ushort uVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  ushort uVar120;
  short sVar121;
  ushort uVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar125 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar129 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar130 [16];
  long local_f0;
  ushort local_88;
  ushort uStack_86;
  __m128i_16_t e;
  __m128i_16_t h;
  ushort uVar94;
  ushort uVar96;
  ushort uVar98;
  ushort uVar100;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar45 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar45 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar45 = "profile->matrix";
      }
      else {
        uVar43 = profile->s1Len;
        if ((int)uVar43 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar45 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar45 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar45 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar45 = "open";
        }
        else {
          if (-1 < gap) {
            uVar47 = uVar43 - 1;
            size = (ulong)uVar43 + 7 >> 3;
            iVar53 = -open;
            iVar37 = ppVar5->min;
            iVar38 = -iVar37;
            if (iVar37 != iVar53 && SBORROW4(iVar37,iVar53) == iVar37 + open < 0) {
              iVar38 = open;
            }
            iVar37 = ppVar5->max;
            a = (int)size;
            ppVar39 = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (ppVar39 != (parasail_result_t *)0x0) {
              ppVar39->flag = ppVar39->flag | 0x8280801;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar40 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              palVar41 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_03 != (int16_t *)0x0 &&
                  (ptr_02 != (__m128i *)0x0 && palVar41 != (__m128i *)0x0)) &&
                  ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar40 != (__m128i *)0x0 && ptr != (__m128i *)0x0))) {
                iVar36 = s2Len + -1;
                auVar60 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar57 = auVar60._0_4_;
                auVar60 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar58 = auVar60._0_4_;
                uVar43 = iVar38 - 0x7fff;
                auVar60 = pshuflw(ZEXT416(uVar43),ZEXT416(uVar43),0);
                local_88 = auVar60._0_2_;
                uStack_86 = auVar60._2_2_;
                auVar61 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R12 >> 0x10),
                                                 0x7ffe - (short)iVar37));
                _Var62 = (__m128i_16_t)pshuflw(auVar61,auVar61,0);
                uVar59 = (undefined4)_Var62.m[0];
                sVar114 = _Var62.v[0];
                sVar117 = _Var62.v[1];
                lVar46 = (long)iVar53;
                for (uVar48 = 0; uVar48 != size; uVar48 = uVar48 + 1) {
                  lVar50 = lVar46;
                  for (lVar51 = 0; lVar51 != 8; lVar51 = lVar51 + 1) {
                    lVar52 = -0x8000;
                    if (-0x8000 < lVar50) {
                      lVar52 = lVar50;
                    }
                    lVar44 = lVar50 - (ulong)(uint)open;
                    if (lVar44 < -0x7fff) {
                      lVar44 = -0x8000;
                    }
                    *(short *)((long)&h + lVar51 * 2) = (short)lVar52;
                    *(short *)((long)&e + lVar51 * 2) = (short)lVar44;
                    lVar50 = lVar50 - size * (uint)gap;
                  }
                  ptr[uVar48][0] = h.m[0];
                  ptr[uVar48][1] = h.m[1];
                  *(__m128i_16_t *)(ptr_00 + uVar48) = e;
                  *(__m128i_16_t *)(ptr_01 + uVar48) = e;
                  lVar46 = lVar46 - (ulong)(uint)gap;
                  _Var62 = e;
                }
                *ptr_03 = 0;
                for (uVar48 = 1; s2Len + 1 != uVar48; uVar48 = uVar48 + 1) {
                  iVar42 = -0x8000;
                  if (-0x8000 < iVar53) {
                    iVar42 = (int16_t)iVar53;
                  }
                  ptr_03[uVar48] = iVar42;
                  iVar53 = iVar53 - gap;
                }
                lVar50 = size * 0x10;
                lVar46 = 0;
                auVar61 = pmovsxbw((undefined1  [16])_Var62,0x808080808080808);
                for (; lVar50 != lVar46; lVar46 = lVar46 + 0x10) {
                  *(undefined1 (*) [16])((long)((ppVar39->field_4).rowcols)->score_row + lVar46) =
                       auVar61;
                }
                lVar46 = 0;
                auVar129 = pmovsxbw(in_XMM14,0x202020202020202);
                auVar61 = pmovsxbw(in_XMM11,0x4040404040404040);
                auVar126 = pmovsxbw(in_XMM12,0x2020202020202020);
                auVar130 = pmovsxbw(in_XMM15,0x404040404040404);
                uVar48 = 0;
                uVar33 = uVar59;
                uVar34 = uVar59;
                uVar35 = uVar59;
                uVar103 = local_88;
                uVar104 = uStack_86;
                uVar105 = local_88;
                uVar106 = uStack_86;
                uVar107 = local_88;
                uVar108 = uStack_86;
                uVar109 = local_88;
                uVar110 = uStack_86;
                local_f0 = lVar50;
                do {
                  ptr_05 = palVar41;
                  ptr_04 = palVar40;
                  if (uVar48 == (uint)s2Len) {
                    alVar70 = ptr[(ulong)uVar47 % size];
                    iVar37 = 0;
                    while( true ) {
                      uVar48 = alVar70[0];
                      lVar46 = alVar70[1];
                      if (7 - (int)(uVar47 / size) <= iVar37) break;
                      alVar70[0] = uVar48 << 0x10;
                      alVar70[1] = lVar46 << 0x10 | uVar48 >> 0x30;
                      iVar37 = iVar37 + 1;
                    }
                    auVar60._0_2_ = -(ushort)((short)uVar59 < (short)local_88);
                    auVar60._2_2_ = -(ushort)((short)((uint)uVar59 >> 0x10) < (short)uStack_86);
                    auVar60._4_2_ = -(ushort)((short)uVar33 < (short)local_88);
                    auVar60._6_2_ = -(ushort)((short)((uint)uVar33 >> 0x10) < (short)uStack_86);
                    auVar60._8_2_ = -(ushort)((short)uVar34 < (short)local_88);
                    auVar60._10_2_ = -(ushort)((short)((uint)uVar34 >> 0x10) < (short)uStack_86);
                    auVar60._12_2_ = -(ushort)((short)uVar35 < (short)local_88);
                    auVar60._14_2_ = -(ushort)((short)((uint)uVar35 >> 0x10) < (short)uStack_86);
                    auVar61._0_2_ = -(ushort)(sVar114 < (short)uVar103);
                    auVar61._2_2_ = -(ushort)(sVar117 < (short)uVar104);
                    auVar61._4_2_ = -(ushort)(sVar114 < (short)uVar105);
                    auVar61._6_2_ = -(ushort)(sVar117 < (short)uVar106);
                    auVar61._8_2_ = -(ushort)(sVar114 < (short)uVar107);
                    auVar61._10_2_ = -(ushort)(sVar117 < (short)uVar108);
                    auVar61._12_2_ = -(ushort)(sVar114 < (short)uVar109);
                    auVar61._14_2_ = -(ushort)(sVar117 < (short)uVar110);
                    auVar61 = auVar61 | auVar60;
                    if ((((((((((((((((auVar61 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar61 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar61 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar61 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar61 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar61 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar61 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar61 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar61 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar61 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar61 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar61 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar61 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar61[0xf]) {
                      sVar114 = alVar70[1]._6_2_;
                    }
                    else {
                      *(byte *)&ppVar39->flag = (byte)ppVar39->flag | 0x40;
                      sVar114 = 0;
                      iVar36 = 0;
                      uVar47 = 0;
                    }
                    ppVar39->score = (int)sVar114;
                    ppVar39->end_query = uVar47;
                    ppVar39->end_ref = iVar36;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_05);
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_04);
                    parasail_free(ptr);
                    return ppVar39;
                  }
                  uVar1 = ptr[a - 1U][0];
                  auVar63._8_8_ = ptr[a - 1U][1] << 0x10 | uVar1 >> 0x30;
                  auVar63._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_03[uVar48];
                  iVar37 = ppVar5->mapper[(byte)s2[uVar48]] * a;
                  uVar1 = uVar48 + 1;
                  uVar49 = 1;
                  lVar51 = 0;
                  auVar84._4_2_ = local_88;
                  auVar84._0_4_ = auVar60._0_4_;
                  auVar84._6_2_ = uStack_86;
                  auVar84._8_2_ = local_88;
                  auVar84._10_2_ = uStack_86;
                  auVar84._12_2_ = local_88;
                  auVar84._14_2_ = uStack_86;
                  while( true ) {
                    sVar124 = (short)((uint)uVar35 >> 0x10);
                    sVar123 = (short)uVar35;
                    sVar121 = (short)((uint)uVar34 >> 0x10);
                    sVar119 = (short)uVar34;
                    sVar118 = (short)((uint)uVar33 >> 0x10);
                    sVar116 = (short)uVar33;
                    sVar113 = (short)((uint)uVar59 >> 0x10);
                    sVar112 = (short)uVar59;
                    if (lVar50 == lVar51) break;
                    auVar102 = *(undefined1 (*) [16])((long)*ptr_00 + lVar51);
                    auVar63 = paddsw(auVar63,*(undefined1 (*) [16])
                                              ((long)pvVar4 + lVar51 + (long)iVar37 * 0x10));
                    sVar7 = auVar102._0_2_;
                    uVar111 = auVar63._0_2_;
                    uVar85 = (ushort)((short)uVar111 < sVar7) * sVar7 |
                             ((short)uVar111 >= sVar7) * uVar111;
                    sVar10 = auVar102._2_2_;
                    uVar115 = auVar63._2_2_;
                    uVar90 = (ushort)((short)uVar115 < sVar10) * sVar10 |
                             ((short)uVar115 >= sVar10) * uVar115;
                    sVar56 = auVar102._4_2_;
                    uVar120 = auVar63._4_2_;
                    uVar91 = (ushort)((short)uVar120 < sVar56) * sVar56 |
                             ((short)uVar120 >= sVar56) * uVar120;
                    sVar77 = auVar102._6_2_;
                    uVar122 = auVar63._6_2_;
                    uVar92 = (ushort)((short)uVar122 < sVar77) * sVar77 |
                             ((short)uVar122 >= sVar77) * uVar122;
                    sVar13 = auVar102._8_2_;
                    uVar94 = auVar63._8_2_;
                    uVar93 = (ushort)((short)uVar94 < sVar13) * sVar13 |
                             ((short)uVar94 >= sVar13) * uVar94;
                    sVar16 = auVar102._10_2_;
                    uVar96 = auVar63._10_2_;
                    uVar95 = (ushort)((short)uVar96 < sVar16) * sVar16 |
                             ((short)uVar96 >= sVar16) * uVar96;
                    sVar19 = auVar102._12_2_;
                    uVar98 = auVar63._12_2_;
                    uVar100 = auVar63._14_2_;
                    uVar97 = (ushort)((short)uVar98 < sVar19) * sVar19 |
                             ((short)uVar98 >= sVar19) * uVar98;
                    sVar22 = auVar102._14_2_;
                    uVar99 = (ushort)((short)uVar100 < sVar22) * sVar22 |
                             ((short)uVar100 >= sVar22) * uVar100;
                    sVar8 = auVar84._0_2_;
                    auVar125._0_2_ =
                         (ushort)((short)uVar85 < sVar8) * sVar8 | ((short)uVar85 >= sVar8) * uVar85
                    ;
                    sVar11 = auVar84._2_2_;
                    auVar125._2_2_ =
                         (ushort)((short)uVar90 < sVar11) * sVar11 |
                         ((short)uVar90 >= sVar11) * uVar90;
                    sVar72 = auVar84._4_2_;
                    auVar125._4_2_ =
                         (ushort)((short)uVar91 < sVar72) * sVar72 |
                         ((short)uVar91 >= sVar72) * uVar91;
                    sVar79 = auVar84._6_2_;
                    auVar125._6_2_ =
                         (ushort)((short)uVar92 < sVar79) * sVar79 |
                         ((short)uVar92 >= sVar79) * uVar92;
                    sVar14 = auVar84._8_2_;
                    auVar125._8_2_ =
                         (ushort)((short)uVar93 < sVar14) * sVar14 |
                         ((short)uVar93 >= sVar14) * uVar93;
                    sVar17 = auVar84._10_2_;
                    auVar125._10_2_ =
                         (ushort)((short)uVar95 < sVar17) * sVar17 |
                         ((short)uVar95 >= sVar17) * uVar95;
                    sVar20 = auVar84._12_2_;
                    auVar125._12_2_ =
                         (ushort)((short)uVar97 < sVar20) * sVar20 |
                         ((short)uVar97 >= sVar20) * uVar97;
                    sVar23 = auVar84._14_2_;
                    auVar125._14_2_ =
                         (ushort)((short)uVar99 < sVar23) * sVar23 |
                         ((short)uVar99 >= sVar23) * uVar99;
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar51) = auVar125;
                    auVar64._0_2_ = -(ushort)(uVar111 == auVar125._0_2_);
                    auVar64._2_2_ = -(ushort)(uVar115 == auVar125._2_2_);
                    auVar64._4_2_ = -(ushort)(uVar120 == auVar125._4_2_);
                    auVar64._6_2_ = -(ushort)(uVar122 == auVar125._6_2_);
                    auVar64._8_2_ = -(ushort)(uVar94 == auVar125._8_2_);
                    auVar64._10_2_ = -(ushort)(uVar96 == auVar125._10_2_);
                    auVar64._12_2_ = -(ushort)(uVar98 == auVar125._12_2_);
                    auVar64._14_2_ = -(ushort)(uVar100 == auVar125._14_2_);
                    auVar86._0_2_ = auVar129._0_2_ - (ushort)(sVar8 < (short)uVar85);
                    auVar86._2_2_ = auVar129._2_2_ - (ushort)(sVar11 < (short)uVar90);
                    auVar86._4_2_ = auVar129._4_2_ - (ushort)(sVar72 < (short)uVar91);
                    auVar86._6_2_ = auVar129._6_2_ - (ushort)(sVar79 < (short)uVar92);
                    auVar86._8_2_ = auVar129._8_2_ - (ushort)(sVar14 < (short)uVar93);
                    auVar86._10_2_ = auVar129._10_2_ - (ushort)(sVar17 < (short)uVar95);
                    auVar86._12_2_ = auVar129._12_2_ - (ushort)(sVar20 < (short)uVar97);
                    auVar86._14_2_ = auVar129._14_2_ - (ushort)(sVar23 < (short)uVar99);
                    auVar87 = pblendvb(auVar86,auVar130,auVar64);
                    auVar63 = *(undefined1 (*) [16])
                               ((long)((ppVar39->field_4).rowcols)->score_row + lVar51 + lVar46);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar51) = auVar87;
                    *(undefined1 (*) [16])
                     ((long)((ppVar39->field_4).rowcols)->score_row + lVar51 + lVar46) =
                         auVar63 | auVar87;
                    auVar25._4_4_ = uVar57;
                    auVar25._0_4_ = uVar57;
                    auVar25._8_4_ = uVar57;
                    auVar25._12_4_ = uVar57;
                    in_XMM3 = psubsw(auVar125,auVar25);
                    auVar27._4_4_ = uVar58;
                    auVar27._0_4_ = uVar58;
                    auVar27._8_4_ = uVar58;
                    auVar27._12_4_ = uVar58;
                    auVar63 = psubsw(auVar102,auVar27);
                    sVar9 = in_XMM3._0_2_;
                    sVar55 = auVar63._0_2_;
                    sVar12 = in_XMM3._2_2_;
                    sVar71 = auVar63._2_2_;
                    sVar74 = in_XMM3._4_2_;
                    sVar73 = auVar63._4_2_;
                    sVar81 = in_XMM3._6_2_;
                    sVar75 = auVar63._6_2_;
                    sVar15 = in_XMM3._8_2_;
                    sVar76 = auVar63._8_2_;
                    sVar18 = in_XMM3._10_2_;
                    sVar78 = auVar63._10_2_;
                    sVar21 = in_XMM3._12_2_;
                    sVar80 = auVar63._12_2_;
                    sVar82 = auVar63._14_2_;
                    sVar24 = in_XMM3._14_2_;
                    puVar2 = (ushort *)((long)*ptr_00 + lVar51);
                    *puVar2 = (ushort)(sVar55 < sVar9) * sVar9 | (ushort)(sVar55 >= sVar9) * sVar55;
                    puVar2[1] = (ushort)(sVar71 < sVar12) * sVar12 |
                                (ushort)(sVar71 >= sVar12) * sVar71;
                    puVar2[2] = (ushort)(sVar73 < sVar74) * sVar74 |
                                (ushort)(sVar73 >= sVar74) * sVar73;
                    puVar2[3] = (ushort)(sVar75 < sVar81) * sVar81 |
                                (ushort)(sVar75 >= sVar81) * sVar75;
                    puVar2[4] = (ushort)(sVar76 < sVar15) * sVar15 |
                                (ushort)(sVar76 >= sVar15) * sVar76;
                    puVar2[5] = (ushort)(sVar78 < sVar18) * sVar18 |
                                (ushort)(sVar78 >= sVar18) * sVar78;
                    puVar2[6] = (ushort)(sVar80 < sVar21) * sVar21 |
                                (ushort)(sVar80 >= sVar21) * sVar80;
                    puVar2[7] = (ushort)(sVar82 < sVar24) * sVar24 |
                                (ushort)(sVar82 >= sVar24) * sVar82;
                    auVar28._4_4_ = uVar58;
                    auVar28._0_4_ = uVar58;
                    auVar28._8_4_ = uVar58;
                    auVar28._12_4_ = uVar58;
                    auVar63 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar51),auVar28);
                    sVar55 = auVar63._0_2_;
                    sVar71 = auVar63._2_2_;
                    sVar73 = auVar63._4_2_;
                    sVar75 = auVar63._6_2_;
                    sVar76 = auVar63._8_2_;
                    sVar78 = auVar63._10_2_;
                    sVar80 = auVar63._12_2_;
                    sVar82 = auVar63._14_2_;
                    puVar2 = (ushort *)((long)*ptr_05 + lVar51);
                    *puVar2 = (ushort)(sVar9 < sVar55) * sVar55 | (ushort)(sVar9 >= sVar55) * sVar9;
                    puVar2[1] = (ushort)(sVar12 < sVar71) * sVar71 |
                                (ushort)(sVar12 >= sVar71) * sVar12;
                    puVar2[2] = (ushort)(sVar74 < sVar73) * sVar73 |
                                (ushort)(sVar74 >= sVar73) * sVar74;
                    puVar2[3] = (ushort)(sVar81 < sVar75) * sVar75 |
                                (ushort)(sVar81 >= sVar75) * sVar81;
                    puVar2[4] = (ushort)(sVar15 < sVar76) * sVar76 |
                                (ushort)(sVar15 >= sVar76) * sVar15;
                    puVar2[5] = (ushort)(sVar18 < sVar78) * sVar78 |
                                (ushort)(sVar18 >= sVar78) * sVar18;
                    puVar2[6] = (ushort)(sVar21 < sVar80) * sVar80 |
                                (ushort)(sVar21 >= sVar80) * sVar21;
                    puVar2[7] = (ushort)(sVar24 < sVar82) * sVar82 |
                                (ushort)(sVar24 >= sVar82) * sVar24;
                    if ((int)uVar1 < s2Len) {
                      auVar65._0_2_ = -(ushort)(sVar55 < sVar9);
                      auVar65._2_2_ = -(ushort)(sVar71 < sVar12);
                      auVar65._4_2_ = -(ushort)(sVar73 < sVar74);
                      auVar65._6_2_ = -(ushort)(sVar75 < sVar81);
                      auVar65._8_2_ = -(ushort)(sVar76 < sVar15);
                      auVar65._10_2_ = -(ushort)(sVar78 < sVar18);
                      auVar65._12_2_ = -(ushort)(sVar80 < sVar21);
                      auVar65._14_2_ = -(ushort)(sVar82 < sVar24);
                      auVar63 = pmovsxbw(auVar63,0x1010101010101010);
                      auVar63 = pblendvb(auVar63,_DAT_008a1bb0,auVar65);
                      *(undefined1 (*) [16])
                       ((long)((ppVar39->field_4).rowcols)->score_row + lVar51 + local_f0) = auVar63
                      ;
                    }
                    auVar29._4_4_ = uVar58;
                    auVar29._0_4_ = uVar58;
                    auVar29._8_4_ = uVar58;
                    auVar29._12_4_ = uVar58;
                    in_XMM2 = psubsw(auVar84,auVar29);
                    sVar55 = in_XMM2._0_2_;
                    sVar71 = in_XMM2._2_2_;
                    sVar73 = in_XMM2._4_2_;
                    sVar75 = in_XMM2._6_2_;
                    sVar76 = in_XMM2._8_2_;
                    sVar78 = in_XMM2._10_2_;
                    sVar80 = in_XMM2._12_2_;
                    sVar82 = in_XMM2._14_2_;
                    if (uVar49 < size) {
                      piVar6 = ((ppVar39->field_4).rowcols)->score_row;
                      auVar66._0_2_ = -(ushort)(sVar55 < sVar9);
                      auVar66._2_2_ = -(ushort)(sVar71 < sVar12);
                      auVar66._4_2_ = -(ushort)(sVar73 < sVar74);
                      auVar66._6_2_ = -(ushort)(sVar75 < sVar81);
                      auVar66._8_2_ = -(ushort)(sVar76 < sVar15);
                      auVar66._10_2_ = -(ushort)(sVar78 < sVar18);
                      auVar66._12_2_ = -(ushort)(sVar80 < sVar21);
                      auVar66._14_2_ = -(ushort)(sVar82 < sVar24);
                      auVar63 = pblendvb(auVar61,auVar126,auVar66);
                      *(undefined1 (*) [16])((long)piVar6 + lVar51 + 0x10 + lVar46) =
                           auVar63 | *(undefined1 (*) [16])((long)piVar6 + lVar51 + 0x10 + lVar46);
                    }
                    uVar103 = ((short)uVar103 < (short)auVar125._0_2_) * auVar125._0_2_ |
                              ((short)uVar103 >= (short)auVar125._0_2_) * uVar103;
                    uVar104 = ((short)uVar104 < (short)auVar125._2_2_) * auVar125._2_2_ |
                              ((short)uVar104 >= (short)auVar125._2_2_) * uVar104;
                    uVar105 = ((short)uVar105 < (short)auVar125._4_2_) * auVar125._4_2_ |
                              ((short)uVar105 >= (short)auVar125._4_2_) * uVar105;
                    uVar106 = ((short)uVar106 < (short)auVar125._6_2_) * auVar125._6_2_ |
                              ((short)uVar106 >= (short)auVar125._6_2_) * uVar106;
                    uVar107 = ((short)uVar107 < (short)auVar125._8_2_) * auVar125._8_2_ |
                              ((short)uVar107 >= (short)auVar125._8_2_) * uVar107;
                    uVar108 = ((short)uVar108 < (short)auVar125._10_2_) * auVar125._10_2_ |
                              ((short)uVar108 >= (short)auVar125._10_2_) * uVar108;
                    uVar109 = ((short)uVar109 < (short)auVar125._12_2_) * auVar125._12_2_ |
                              ((short)uVar109 >= (short)auVar125._12_2_) * uVar109;
                    uVar110 = ((short)uVar110 < (short)auVar125._14_2_) * auVar125._14_2_ |
                              ((short)uVar110 >= (short)auVar125._14_2_) * uVar110;
                    uVar111 = (ushort)(sVar7 < sVar112) * sVar7 |
                              (ushort)(sVar7 >= sVar112) * sVar112;
                    uVar85 = (ushort)(sVar10 < sVar113) * sVar10 |
                             (ushort)(sVar10 >= sVar113) * sVar113;
                    uVar115 = (ushort)(sVar56 < sVar116) * sVar56 |
                              (ushort)(sVar56 >= sVar116) * sVar116;
                    uVar90 = (ushort)(sVar77 < sVar118) * sVar77 |
                             (ushort)(sVar77 >= sVar118) * sVar118;
                    uVar91 = (ushort)(sVar13 < sVar119) * sVar13 |
                             (ushort)(sVar13 >= sVar119) * sVar119;
                    uVar120 = (ushort)(sVar16 < sVar121) * sVar16 |
                              (ushort)(sVar16 >= sVar121) * sVar121;
                    uVar122 = (ushort)(sVar19 < sVar123) * sVar19 |
                              (ushort)(sVar19 >= sVar123) * sVar123;
                    uVar92 = (ushort)(sVar22 < sVar124) * sVar22 |
                             (ushort)(sVar22 >= sVar124) * sVar124;
                    uVar111 = (ushort)(sVar8 < (short)uVar111) * sVar8 |
                              (sVar8 >= (short)uVar111) * uVar111;
                    uVar85 = (ushort)(sVar11 < (short)uVar85) * sVar11 |
                             (sVar11 >= (short)uVar85) * uVar85;
                    uVar115 = (ushort)(sVar72 < (short)uVar115) * sVar72 |
                              (sVar72 >= (short)uVar115) * uVar115;
                    uVar90 = (ushort)(sVar79 < (short)uVar90) * sVar79 |
                             (sVar79 >= (short)uVar90) * uVar90;
                    uVar91 = (ushort)(sVar14 < (short)uVar91) * sVar14 |
                             (sVar14 >= (short)uVar91) * uVar91;
                    uVar120 = (ushort)(sVar17 < (short)uVar120) * sVar17 |
                              (sVar17 >= (short)uVar120) * uVar120;
                    uVar122 = (ushort)(sVar20 < (short)uVar122) * sVar20 |
                              (sVar20 >= (short)uVar122) * uVar122;
                    uVar92 = (ushort)(sVar23 < (short)uVar92) * sVar23 |
                             (sVar23 >= (short)uVar92) * uVar92;
                    uVar59 = CONCAT22(((short)auVar125._2_2_ < (short)uVar85) * auVar125._2_2_ |
                                      ((short)auVar125._2_2_ >= (short)uVar85) * uVar85,
                                      ((short)auVar125._0_2_ < (short)uVar111) * auVar125._0_2_ |
                                      ((short)auVar125._0_2_ >= (short)uVar111) * uVar111);
                    uVar33 = CONCAT22(((short)auVar125._6_2_ < (short)uVar90) * auVar125._6_2_ |
                                      ((short)auVar125._6_2_ >= (short)uVar90) * uVar90,
                                      ((short)auVar125._4_2_ < (short)uVar115) * auVar125._4_2_ |
                                      ((short)auVar125._4_2_ >= (short)uVar115) * uVar115);
                    uVar34 = CONCAT22(((short)auVar125._10_2_ < (short)uVar120) * auVar125._10_2_ |
                                      ((short)auVar125._10_2_ >= (short)uVar120) * uVar120,
                                      ((short)auVar125._8_2_ < (short)uVar91) * auVar125._8_2_ |
                                      ((short)auVar125._8_2_ >= (short)uVar91) * uVar91);
                    uVar35 = CONCAT22(((short)auVar125._14_2_ < (short)uVar92) * auVar125._14_2_ |
                                      ((short)auVar125._14_2_ >= (short)uVar92) * uVar92,
                                      ((short)auVar125._12_2_ < (short)uVar122) * auVar125._12_2_ |
                                      ((short)auVar125._12_2_ >= (short)uVar122) * uVar122);
                    auVar84._0_2_ =
                         (ushort)(sVar9 < sVar55) * sVar55 | (ushort)(sVar9 >= sVar55) * sVar9;
                    auVar84._2_2_ =
                         (ushort)(sVar12 < sVar71) * sVar71 | (ushort)(sVar12 >= sVar71) * sVar12;
                    auVar84._4_2_ =
                         (ushort)(sVar74 < sVar73) * sVar73 | (ushort)(sVar74 >= sVar73) * sVar74;
                    auVar84._6_2_ =
                         (ushort)(sVar81 < sVar75) * sVar75 | (ushort)(sVar81 >= sVar75) * sVar81;
                    auVar84._8_2_ =
                         (ushort)(sVar15 < sVar76) * sVar76 | (ushort)(sVar15 >= sVar76) * sVar15;
                    auVar84._10_2_ =
                         (ushort)(sVar18 < sVar78) * sVar78 | (ushort)(sVar18 >= sVar78) * sVar18;
                    auVar84._12_2_ =
                         (ushort)(sVar21 < sVar80) * sVar80 | (ushort)(sVar21 >= sVar80) * sVar21;
                    auVar84._14_2_ =
                         (ushort)(sVar24 < sVar82) * sVar82 | (ushort)(sVar24 >= sVar82) * sVar24;
                    auVar63 = *(undefined1 (*) [16])((long)*ptr + lVar51);
                    lVar51 = lVar51 + 0x10;
                    uVar49 = uVar49 + 1;
                  }
                  auVar102 = in_XMM2;
                  auVar87 = auVar84;
                  for (iVar38 = 0; iVar38 != 8; iVar38 = iVar38 + 1) {
                    uVar49 = (ulong)(uint)(ptr_03[uVar1] - open);
                    if (ptr_03[uVar1] - open < -0x7fff) {
                      uVar49 = 0xffff8000;
                    }
                    uVar83 = ptr[a - 1U][0];
                    auVar128._8_8_ = ptr[a - 1U][1] << 0x10 | uVar83 >> 0x30;
                    auVar128._0_8_ = uVar83 << 0x10 | (ulong)(ushort)ptr_03[uVar48];
                    uVar83 = in_XMM3._0_8_;
                    in_XMM3._8_8_ = in_XMM3._8_8_ << 0x10 | uVar83 >> 0x30;
                    in_XMM3._0_8_ = uVar83 << 0x10 | uVar49 & 0xffff;
                    auVar88._8_8_ = in_XMM2._8_8_ << 0x10 | in_XMM2._0_8_ >> 0x30;
                    auVar88._0_8_ = in_XMM2._0_8_ << 0x10 | (ulong)(ushort)uVar43;
                    uVar83 = auVar84._0_8_;
                    auVar84._8_8_ = auVar84._8_8_ << 0x10 | uVar83 >> 0x30;
                    auVar84._0_8_ = uVar83 << 0x10 | uVar49 & 0xffff;
                    uVar83 = auVar102._0_8_;
                    auVar102._8_8_ = auVar102._8_8_ << 0x10 | uVar83 >> 0x30;
                    auVar102._0_8_ = uVar83 << 0x10 | (ulong)(ushort)uVar43;
                    uVar83 = auVar87._0_8_;
                    auVar87._8_8_ = auVar87._8_8_ << 0x10 | uVar83 >> 0x30;
                    auVar87._0_8_ = uVar83 << 0x10 | uVar49 & 0xffff;
                    lVar52 = 0;
                    uVar49 = size;
                    lVar51 = lVar46;
                    in_XMM2 = auVar88;
                    while( true ) {
                      sVar124 = (short)((uint)uVar35 >> 0x10);
                      sVar123 = (short)uVar35;
                      sVar121 = (short)((uint)uVar34 >> 0x10);
                      sVar119 = (short)uVar34;
                      sVar118 = (short)((uint)uVar33 >> 0x10);
                      sVar116 = (short)uVar33;
                      sVar113 = (short)((uint)uVar59 >> 0x10);
                      sVar112 = (short)uVar59;
                      bVar54 = uVar49 == 0;
                      uVar49 = uVar49 - 1;
                      if (bVar54) break;
                      psVar3 = (short *)((long)*ptr_04 + lVar52);
                      sVar56 = *psVar3;
                      sVar72 = psVar3[1];
                      sVar74 = psVar3[2];
                      sVar73 = psVar3[3];
                      sVar77 = psVar3[4];
                      sVar79 = psVar3[5];
                      sVar81 = psVar3[6];
                      sVar75 = psVar3[7];
                      sVar7 = auVar84._0_2_;
                      auVar89._0_2_ =
                           (ushort)(sVar56 < sVar7) * sVar7 | (ushort)(sVar56 >= sVar7) * sVar56;
                      sVar8 = auVar84._2_2_;
                      auVar89._2_2_ =
                           (ushort)(sVar72 < sVar8) * sVar8 | (ushort)(sVar72 >= sVar8) * sVar72;
                      sVar9 = auVar84._4_2_;
                      auVar89._4_2_ =
                           (ushort)(sVar74 < sVar9) * sVar9 | (ushort)(sVar74 >= sVar9) * sVar74;
                      sVar55 = auVar84._6_2_;
                      auVar89._6_2_ =
                           (ushort)(sVar73 < sVar55) * sVar55 | (ushort)(sVar73 >= sVar55) * sVar73;
                      sVar10 = auVar84._8_2_;
                      auVar89._8_2_ =
                           (ushort)(sVar77 < sVar10) * sVar10 | (ushort)(sVar77 >= sVar10) * sVar77;
                      sVar11 = auVar84._10_2_;
                      auVar89._10_2_ =
                           (ushort)(sVar79 < sVar11) * sVar11 | (ushort)(sVar79 >= sVar11) * sVar79;
                      sVar12 = auVar84._12_2_;
                      auVar89._12_2_ =
                           (ushort)(sVar81 < sVar12) * sVar12 | (ushort)(sVar81 >= sVar12) * sVar81;
                      sVar71 = auVar84._14_2_;
                      auVar89._14_2_ =
                           (ushort)(sVar75 < sVar71) * sVar71 | (ushort)(sVar75 >= sVar71) * sVar75;
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar52) = auVar89;
                      auVar63 = paddsw(auVar128,*(undefined1 (*) [16])
                                                 ((long)pvVar4 + lVar52 + (long)iVar37 * 0x10));
                      auVar127._0_2_ = -(ushort)(auVar63._0_2_ == auVar89._0_2_);
                      auVar127._2_2_ = -(ushort)(auVar63._2_2_ == auVar89._2_2_);
                      auVar127._4_2_ = -(ushort)(auVar63._4_2_ == auVar89._4_2_);
                      auVar127._6_2_ = -(ushort)(auVar63._6_2_ == auVar89._6_2_);
                      auVar127._8_2_ = -(ushort)(auVar63._8_2_ == auVar89._8_2_);
                      auVar127._10_2_ = -(ushort)(auVar63._10_2_ == auVar89._10_2_);
                      auVar127._12_2_ = -(ushort)(auVar63._12_2_ == auVar89._12_2_);
                      auVar127._14_2_ = -(ushort)(auVar63._14_2_ == auVar89._14_2_);
                      auVar67._0_2_ = -(ushort)(sVar7 < sVar56);
                      auVar67._2_2_ = -(ushort)(sVar8 < sVar72);
                      auVar67._4_2_ = -(ushort)(sVar9 < sVar74);
                      auVar67._6_2_ = -(ushort)(sVar55 < sVar73);
                      auVar67._8_2_ = -(ushort)(sVar10 < sVar77);
                      auVar67._10_2_ = -(ushort)(sVar11 < sVar79);
                      auVar67._12_2_ = -(ushort)(sVar12 < sVar81);
                      auVar67._14_2_ = -(ushort)(sVar71 < sVar75);
                      auVar128 = *(undefined1 (*) [16])
                                  ((long)((ppVar39->field_4).rowcols)->score_row + lVar51) &
                                 _DAT_008a3a20;
                      auVar63 = pblendvb(auVar129,*(undefined1 (*) [16])((long)*ptr_02 + lVar52),
                                         auVar67 | auVar127);
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar52) = auVar63;
                      *(undefined1 (*) [16])((long)((ppVar39->field_4).rowcols)->score_row + lVar51)
                           = auVar63 | auVar128;
                      piVar6 = ((ppVar39->field_4).rowcols)->score_row;
                      auVar101._0_2_ = -(ushort)(auVar102._0_2_ < in_XMM3._0_2_);
                      auVar101._2_2_ = -(ushort)(auVar102._2_2_ < in_XMM3._2_2_);
                      auVar101._4_2_ = -(ushort)(auVar102._4_2_ < in_XMM3._4_2_);
                      auVar101._6_2_ = -(ushort)(auVar102._6_2_ < in_XMM3._6_2_);
                      auVar101._8_2_ = -(ushort)(auVar102._8_2_ < in_XMM3._8_2_);
                      auVar101._10_2_ = -(ushort)(auVar102._10_2_ < in_XMM3._10_2_);
                      auVar101._12_2_ = -(ushort)(auVar102._12_2_ < in_XMM3._12_2_);
                      auVar101._14_2_ = -(ushort)(auVar102._14_2_ < in_XMM3._14_2_);
                      auVar63 = pblendvb(auVar61,auVar126,auVar101);
                      *(undefined1 (*) [16])((long)piVar6 + lVar51) =
                           *(undefined1 (*) [16])((long)piVar6 + lVar51) & _DAT_008a3a30 | auVar63;
                      auVar26._4_4_ = uVar57;
                      auVar26._0_4_ = uVar57;
                      auVar26._8_4_ = uVar57;
                      auVar26._12_4_ = uVar57;
                      in_XMM3 = psubsw(auVar89,auVar26);
                      auVar30._4_4_ = uVar58;
                      auVar30._0_4_ = uVar58;
                      auVar30._8_4_ = uVar58;
                      auVar30._12_4_ = uVar58;
                      auVar63 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar52),auVar30);
                      sVar7 = auVar63._0_2_;
                      sVar56 = in_XMM3._0_2_;
                      sVar8 = auVar63._2_2_;
                      sVar72 = in_XMM3._2_2_;
                      sVar9 = auVar63._4_2_;
                      sVar74 = in_XMM3._4_2_;
                      sVar55 = auVar63._6_2_;
                      sVar73 = in_XMM3._6_2_;
                      sVar10 = auVar63._8_2_;
                      sVar77 = in_XMM3._8_2_;
                      sVar11 = auVar63._10_2_;
                      sVar79 = in_XMM3._10_2_;
                      sVar12 = auVar63._12_2_;
                      sVar81 = in_XMM3._12_2_;
                      sVar75 = in_XMM3._14_2_;
                      sVar71 = auVar63._14_2_;
                      puVar2 = (ushort *)((long)*ptr_05 + lVar52);
                      *puVar2 = (ushort)(sVar56 < sVar7) * sVar7 |
                                (ushort)(sVar56 >= sVar7) * sVar56;
                      puVar2[1] = (ushort)(sVar72 < sVar8) * sVar8 |
                                  (ushort)(sVar72 >= sVar8) * sVar72;
                      puVar2[2] = (ushort)(sVar74 < sVar9) * sVar9 |
                                  (ushort)(sVar74 >= sVar9) * sVar74;
                      puVar2[3] = (ushort)(sVar73 < sVar55) * sVar55 |
                                  (ushort)(sVar73 >= sVar55) * sVar73;
                      puVar2[4] = (ushort)(sVar77 < sVar10) * sVar10 |
                                  (ushort)(sVar77 >= sVar10) * sVar77;
                      puVar2[5] = (ushort)(sVar79 < sVar11) * sVar11 |
                                  (ushort)(sVar79 >= sVar11) * sVar79;
                      puVar2[6] = (ushort)(sVar81 < sVar12) * sVar12 |
                                  (ushort)(sVar81 >= sVar12) * sVar81;
                      puVar2[7] = (ushort)(sVar75 < sVar71) * sVar71 |
                                  (ushort)(sVar75 >= sVar71) * sVar75;
                      if ((int)uVar1 < s2Len) {
                        auVar68._0_2_ = -(ushort)(sVar7 < sVar56);
                        auVar68._2_2_ = -(ushort)(sVar8 < sVar72);
                        auVar68._4_2_ = -(ushort)(sVar9 < sVar74);
                        auVar68._6_2_ = -(ushort)(sVar55 < sVar73);
                        auVar68._8_2_ = -(ushort)(sVar10 < sVar77);
                        auVar68._10_2_ = -(ushort)(sVar11 < sVar79);
                        auVar68._12_2_ = -(ushort)(sVar12 < sVar81);
                        auVar68._14_2_ = -(ushort)(sVar71 < sVar75);
                        auVar63 = pmovsxbw(auVar63,0x1010101010101010);
                        auVar63 = pblendvb(auVar63,_DAT_008a1bb0,auVar68);
                        *(undefined1 (*) [16])
                         ((long)((ppVar39->field_4).rowcols)->score_row + lVar51 + lVar50) = auVar63
                        ;
                      }
                      uVar59 = CONCAT22(((short)auVar89._2_2_ < sVar113) * auVar89._2_2_ |
                                        (ushort)((short)auVar89._2_2_ >= sVar113) * sVar113,
                                        ((short)auVar89._0_2_ < sVar112) * auVar89._0_2_ |
                                        (ushort)((short)auVar89._0_2_ >= sVar112) * sVar112);
                      uVar33 = CONCAT22(((short)auVar89._6_2_ < sVar118) * auVar89._6_2_ |
                                        (ushort)((short)auVar89._6_2_ >= sVar118) * sVar118,
                                        ((short)auVar89._4_2_ < sVar116) * auVar89._4_2_ |
                                        (ushort)((short)auVar89._4_2_ >= sVar116) * sVar116);
                      uVar34 = CONCAT22(((short)auVar89._10_2_ < sVar121) * auVar89._10_2_ |
                                        (ushort)((short)auVar89._10_2_ >= sVar121) * sVar121,
                                        ((short)auVar89._8_2_ < sVar119) * auVar89._8_2_ |
                                        (ushort)((short)auVar89._8_2_ >= sVar119) * sVar119);
                      uVar35 = CONCAT22(((short)auVar89._14_2_ < sVar124) * auVar89._14_2_ |
                                        (ushort)((short)auVar89._14_2_ >= sVar124) * sVar124,
                                        ((short)auVar89._12_2_ < sVar123) * auVar89._12_2_ |
                                        (ushort)((short)auVar89._12_2_ >= sVar123) * sVar123);
                      uVar103 = ((short)uVar103 < (short)auVar89._0_2_) * auVar89._0_2_ |
                                ((short)uVar103 >= (short)auVar89._0_2_) * uVar103;
                      uVar104 = ((short)uVar104 < (short)auVar89._2_2_) * auVar89._2_2_ |
                                ((short)uVar104 >= (short)auVar89._2_2_) * uVar104;
                      uVar105 = ((short)uVar105 < (short)auVar89._4_2_) * auVar89._4_2_ |
                                ((short)uVar105 >= (short)auVar89._4_2_) * uVar105;
                      uVar106 = ((short)uVar106 < (short)auVar89._6_2_) * auVar89._6_2_ |
                                ((short)uVar106 >= (short)auVar89._6_2_) * uVar106;
                      uVar107 = ((short)uVar107 < (short)auVar89._8_2_) * auVar89._8_2_ |
                                ((short)uVar107 >= (short)auVar89._8_2_) * uVar107;
                      uVar108 = ((short)uVar108 < (short)auVar89._10_2_) * auVar89._10_2_ |
                                ((short)uVar108 >= (short)auVar89._10_2_) * uVar108;
                      uVar109 = ((short)uVar109 < (short)auVar89._12_2_) * auVar89._12_2_ |
                                ((short)uVar109 >= (short)auVar89._12_2_) * uVar109;
                      uVar110 = ((short)uVar110 < (short)auVar89._14_2_) * auVar89._14_2_ |
                                ((short)uVar110 >= (short)auVar89._14_2_) * uVar110;
                      auVar31._4_4_ = uVar58;
                      auVar31._0_4_ = uVar58;
                      auVar31._8_4_ = uVar58;
                      auVar31._12_4_ = uVar58;
                      auVar84 = psubsw(auVar84,auVar31);
                      auVar69._0_2_ = -(ushort)(auVar84._0_2_ < sVar56);
                      auVar69._2_2_ = -(ushort)(auVar84._2_2_ < sVar72);
                      auVar69._4_2_ = -(ushort)(auVar84._4_2_ < sVar74);
                      auVar69._6_2_ = -(ushort)(auVar84._6_2_ < sVar73);
                      auVar69._8_2_ = -(ushort)(auVar84._8_2_ < sVar77);
                      auVar69._10_2_ = -(ushort)(auVar84._10_2_ < sVar79);
                      auVar69._12_2_ = -(ushort)(auVar84._12_2_ < sVar81);
                      auVar69._14_2_ = -(ushort)(auVar84._14_2_ < sVar75);
                      in_XMM2 = auVar84;
                      if ((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar69._14_2_ >> 7) & 1) << 0xe |
                                  auVar69._14_2_ & 0x8000) == 0xffff) goto LAB_007027bf;
                      auVar32._4_4_ = uVar58;
                      auVar32._0_4_ = uVar58;
                      auVar32._8_4_ = uVar58;
                      auVar32._12_4_ = uVar58;
                      auVar102 = psubsw(auVar87,auVar32);
                      sVar112 = auVar102._0_2_;
                      auVar87._0_2_ =
                           (ushort)(sVar56 < sVar112) * sVar112 |
                           (ushort)(sVar56 >= sVar112) * sVar56;
                      sVar112 = auVar102._2_2_;
                      auVar87._2_2_ =
                           (ushort)(sVar72 < sVar112) * sVar112 |
                           (ushort)(sVar72 >= sVar112) * sVar72;
                      sVar112 = auVar102._4_2_;
                      auVar87._4_2_ =
                           (ushort)(sVar74 < sVar112) * sVar112 |
                           (ushort)(sVar74 >= sVar112) * sVar74;
                      sVar112 = auVar102._6_2_;
                      auVar87._6_2_ =
                           (ushort)(sVar73 < sVar112) * sVar112 |
                           (ushort)(sVar73 >= sVar112) * sVar73;
                      sVar112 = auVar102._8_2_;
                      auVar87._8_2_ =
                           (ushort)(sVar77 < sVar112) * sVar112 |
                           (ushort)(sVar77 >= sVar112) * sVar77;
                      sVar112 = auVar102._10_2_;
                      auVar87._10_2_ =
                           (ushort)(sVar79 < sVar112) * sVar112 |
                           (ushort)(sVar79 >= sVar112) * sVar79;
                      sVar112 = auVar102._12_2_;
                      auVar87._12_2_ =
                           (ushort)(sVar81 < sVar112) * sVar112 |
                           (ushort)(sVar81 >= sVar112) * sVar81;
                      sVar112 = auVar102._14_2_;
                      auVar87._14_2_ =
                           (ushort)(sVar75 < sVar112) * sVar112 |
                           (ushort)(sVar75 >= sVar112) * sVar75;
                      auVar128 = *(undefined1 (*) [16])((long)*ptr + lVar52);
                      lVar51 = lVar51 + 0x10;
                      lVar52 = lVar52 + 0x10;
                    }
                  }
LAB_007027bf:
                  local_f0 = local_f0 + lVar50;
                  lVar46 = lVar46 + lVar50;
                  palVar40 = ptr;
                  palVar41 = ptr_01;
                  uVar48 = uVar1;
                  ptr_01 = ptr_05;
                  ptr = ptr_04;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar45 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_trace_striped_profile_sse41_128_16",pcVar45);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8(
                        _mm_blendv_epi8(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}